

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int av1_get_shear_params(WarpedMotionParams *wm)

{
  int16_t iVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  WarpedMotionParams *in_RDI;
  int64_t v;
  int16_t y;
  int16_t shift;
  int32_t *mat;
  int16_t *in_stack_ffffffffffffffa8;
  int local_50;
  uint32_t in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_30;
  byte local_1a;
  int local_4;
  
  iVar2 = is_affine_valid(in_RDI);
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    iVar2 = clamp(in_RDI->wmmat[2] + -0x10000,-0x8000,0x7fff);
    in_RDI->alpha = (int16_t)iVar2;
    iVar2 = clamp(in_RDI->wmmat[3],-0x8000,0x7fff);
    in_RDI->beta = (int16_t)iVar2;
    iVar1 = resolve_divisor_32(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    sVar4 = 1;
    if (in_RDI->wmmat[2] < 0) {
      sVar4 = -1;
    }
    lVar3 = (long)in_RDI->wmmat[4] * 0x10000 * (long)(short)(iVar1 * sVar4);
    if (lVar3 < 0) {
      local_30 = -(int)(((1L << (local_1a & 0x3f)) >> 1) - lVar3 >> (local_1a & 0x3f));
    }
    else {
      local_30 = (int)(lVar3 + ((1L << (local_1a & 0x3f)) >> 1) >> (local_1a & 0x3f));
    }
    iVar2 = clamp(local_30,-0x8000,0x7fff);
    in_RDI->gamma = (int16_t)iVar2;
    lVar3 = (long)in_RDI->wmmat[3] * (long)in_RDI->wmmat[4] * (long)(short)(iVar1 * sVar4);
    if (lVar3 < 0) {
      local_40 = -(int)(((1L << (local_1a & 0x3f)) >> 1) - lVar3 >> (local_1a & 0x3f));
    }
    else {
      local_40 = (int)(lVar3 + ((1L << (local_1a & 0x3f)) >> 1) >> (local_1a & 0x3f));
    }
    iVar2 = clamp((in_RDI->wmmat[5] - local_40) + -0x10000,-0x8000,0x7fff);
    in_RDI->delta = (int16_t)iVar2;
    if (in_RDI->alpha < 0) {
      local_44 = -(0x20 - in_RDI->alpha >> 6);
    }
    else {
      local_44 = in_RDI->alpha + 0x20 >> 6;
    }
    in_RDI->alpha = (int16_t)(local_44 << 6);
    if (in_RDI->beta < 0) {
      local_48 = -(0x20 - in_RDI->beta >> 6);
    }
    else {
      local_48 = in_RDI->beta + 0x20 >> 6;
    }
    in_RDI->beta = (int16_t)(local_48 << 6);
    if (in_RDI->gamma < 0) {
      iVar2 = -(0x20 - in_RDI->gamma >> 6);
    }
    else {
      iVar2 = in_RDI->gamma + 0x20 >> 6;
    }
    in_RDI->gamma = (int16_t)(iVar2 << 6);
    if (in_RDI->delta < 0) {
      local_50 = -(0x20 - in_RDI->delta >> 6);
    }
    else {
      local_50 = in_RDI->delta + 0x20 >> 6;
    }
    in_RDI->delta = (int16_t)(local_50 << 6);
    iVar2 = is_affine_shear_allowed(in_RDI->alpha,in_RDI->beta,in_RDI->gamma,in_RDI->delta);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int av1_get_shear_params(WarpedMotionParams *wm) {
#ifndef NDEBUG
  // Check that models have been constructed sensibly
  // This is a good place to check, because this function does not need to
  // be called until after model construction is complete, but must be called
  // before the model can be used for prediction.
  check_model_consistency(wm);
#endif  // NDEBUG

  const int32_t *mat = wm->wmmat;
  if (!is_affine_valid(wm)) return 0;

  wm->alpha =
      clamp(mat[2] - (1 << WARPEDMODEL_PREC_BITS), INT16_MIN, INT16_MAX);
  wm->beta = clamp(mat[3], INT16_MIN, INT16_MAX);
  int16_t shift;
  int16_t y = resolve_divisor_32(abs(mat[2]), &shift) * (mat[2] < 0 ? -1 : 1);
  int64_t v = ((int64_t)mat[4] * (1 << WARPEDMODEL_PREC_BITS)) * y;
  wm->gamma =
      clamp((int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift), INT16_MIN, INT16_MAX);
  v = ((int64_t)mat[3] * mat[4]) * y;
  wm->delta = clamp(mat[5] - (int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift) -
                        (1 << WARPEDMODEL_PREC_BITS),
                    INT16_MIN, INT16_MAX);

  wm->alpha = ROUND_POWER_OF_TWO_SIGNED(wm->alpha, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->beta = ROUND_POWER_OF_TWO_SIGNED(wm->beta, WARP_PARAM_REDUCE_BITS) *
             (1 << WARP_PARAM_REDUCE_BITS);
  wm->gamma = ROUND_POWER_OF_TWO_SIGNED(wm->gamma, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->delta = ROUND_POWER_OF_TWO_SIGNED(wm->delta, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);

  if (!is_affine_shear_allowed(wm->alpha, wm->beta, wm->gamma, wm->delta))
    return 0;

  return 1;
}